

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_5fb995::cmCaseInsensitiveDirectoryListGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmCaseInsensitiveDirectoryListGenerator *this,
          string *parent)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Status SVar5;
  unsigned_long uVar6;
  char *fname;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_b0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined8 local_88;
  size_t local_80;
  char *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  if (this->Loaded == false) {
    this->CurrentIdx = 0;
    this->Loaded = true;
    SVar5 = cmsys::Directory::Load(&this->DirectoryLister,parent,(string *)0x0);
    if (SVar5.Kind_ != Success) goto LAB_0023d95a;
  }
  uVar1 = this->CurrentIdx;
  uVar6 = cmsys::Directory::GetNumberOfFiles(&this->DirectoryLister);
  if (uVar1 < uVar6) {
    do {
      uVar6 = this->CurrentIdx;
      this->CurrentIdx = uVar6 + 1;
      fname = cmsys::Directory::GetFile(&this->DirectoryLister,uVar6);
      bVar3 = isDirentryToIgnore(fname);
      if ((!bVar3) && (iVar4 = cmsysString_strcasecmp(fname,(this->DirName)._M_str), iVar4 == 0)) {
        local_b0.first._M_str = (parent->_M_dataplus)._M_p;
        local_b0.first._M_len = parent->_M_string_length;
        local_b0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_68 = 0;
        local_60 = 1;
        local_90 = local_50;
        local_50[0] = 0x2f;
        local_98 = 1;
        local_88 = 0;
        local_58 = local_90;
        local_80 = strlen(fname);
        local_70 = 0;
        views._M_len = 3;
        views._M_array = &local_b0;
        local_78 = fname;
        cmCatViews(__return_storage_ptr__,views);
        bVar3 = cmsys::SystemTools::FileIsDirectory(__return_storage_ptr__);
        if (bVar3) {
          return __return_storage_ptr__;
        }
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &__return_storage_ptr__->field_2) {
          operator_delete(pcVar2,(__return_storage_ptr__->field_2)._M_allocated_capacity + 1);
        }
      }
      uVar1 = this->CurrentIdx;
      uVar6 = cmsys::Directory::GetNumberOfFiles(&this->DirectoryLister);
    } while (uVar1 < uVar6);
  }
LAB_0023d95a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (!this->Loaded) {
      this->CurrentIdx = 0ul;
      this->Loaded = true;
      if (!this->DirectoryLister.Load(parent)) {
        return {};
      }
    }

    while (this->CurrentIdx < this->DirectoryLister.GetNumberOfFiles()) {
      const char* const fname =
        this->DirectoryLister.GetFile(this->CurrentIdx++);
      if (isDirentryToIgnore(fname)) {
        continue;
      }
      if (cmsysString_strcasecmp(fname, this->DirName.data()) == 0) {
        auto candidate = cmStrCat(parent, '/', fname);
        if (cmSystemTools::FileIsDirectory(candidate)) {
          return candidate;
        }
      }
    }
    return {};
  }